

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_test.cpp
# Opt level: O3

void __thiscall Pow2_Basics_Test::TestBody(Pow2_Basics_Test *this)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  AssertionResult gtest_ar;
  Message local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  uVar3 = 0;
  do {
    local_50.ss_.ptr_._0_1_ = 1;
    local_48.data_._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,bool>
              (local_40,"true","IsPowerOf2(ui)",(bool *)&local_50,(bool *)&local_48);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      pcVar2 = "";
      if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                 ,0x13,pcVar2);
      testing::internal::AssertHelper::operator=(&local_48,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (uVar3 != 0) {
      local_50.ss_.ptr_._0_1_ = 0;
      local_48.data_._0_1_ = 0;
      testing::internal::CmpHelperEQ<bool,bool>
                (local_40,"false","IsPowerOf2(ui + 1)",(bool *)&local_50,(bool *)&local_48);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message(&local_50);
        pcVar2 = "";
        if (local_38.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                   ,0x15,pcVar2);
        testing::internal::AssertHelper::operator=(&local_48,&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (uVar3 != 1) {
        local_50.ss_.ptr_._0_1_ = 0;
        local_48.data_._0_1_ = POPCOUNT(-1 << (uVar3 & 0x1f)) == 0x1f;
        testing::internal::CmpHelperEQ<bool,bool>
                  (local_40,"false","IsPowerOf2(ui - 1)",(bool *)&local_50,(bool *)&local_48);
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message(&local_50);
          pcVar2 = "";
          if (local_38.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                     ,0x18,pcVar2);
          testing::internal::AssertHelper::operator=(&local_48,&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))
                        ();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x20);
  return;
}

Assistant:

TEST(Pow2, Basics) {
    for (int i = 0; i < 32; ++i) {
        uint32_t ui = 1u << i;
        EXPECT_EQ(true, IsPowerOf2(ui));
        if (ui > 1) {
            EXPECT_EQ(false, IsPowerOf2(ui + 1));
        }
        if (ui > 2) {
            EXPECT_EQ(false, IsPowerOf2(ui - 1));
        }
    }
}